

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O3

string * generateStringVector<gmlc::containers::DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>,helics::CoreBroker::generateQueryAnswer[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)::__2>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    *__return_storage_ptr__,long *data)

{
  long *plVar1;
  string *extraout_RAX;
  string *psVar2;
  long *plVar3;
  string_t local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  data local_40;
  
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  plVar3 = (long *)*data;
  plVar1 = (long *)data[1];
  if (plVar3 != plVar1) {
    do {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,*plVar3,plVar3[1] + *plVar3);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_40,&local_60);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::dump(&local_88,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_40,-1,' ',true,hex);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(__return_storage_ptr__,local_88._M_dataplus._M_p,local_88._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(__return_storage_ptr__,',');
      plVar3 = plVar3 + 0xb;
    } while (plVar3 != plVar1);
  }
  psVar2 = (string *)__return_storage_ptr__->_M_string_length;
  if (psVar2 < (string *)0x2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,']');
    psVar2 = extraout_RAX;
  }
  else {
    ((__return_storage_ptr__->_M_dataplus)._M_p + -1)[(long)psVar2] = ']';
  }
  return psVar2;
}

Assistant:

std::string generateStringVector(const X& data, Proc generator)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        ret.append(helics::generateJsonQuotedString(generator(ele)));
        ret.push_back(',');
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}